

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

void CVmObjBigNum::compute_abs_diff_into(char *new_ext,char *ext1,char *ext2)

{
  int iVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ushort *puVar17;
  int16_t tmp;
  uint uVar18;
  uint uVar19;
  
  if ((ext2[4] & 8U) != 0) {
    copy_val(new_ext,ext1,1);
    return;
  }
  if ((ext1[4] & 8U) != 0) {
    copy_val(new_ext,ext2,1);
    new_ext[4] = new_ext[4] | 1;
    return;
  }
  iVar6 = compare_abs(ext1,ext2);
  puVar17 = (ushort *)ext1;
  if (iVar6 < 0) {
    puVar17 = (ushort *)ext2;
    ext2 = ext1;
  }
  uVar2 = puVar17[1];
  uVar3 = *(ushort *)((long)ext2 + 2);
  uVar4 = uVar2;
  if ((short)uVar2 < (short)uVar3) {
    uVar4 = uVar3;
  }
  uVar18 = (uint)(short)uVar4;
  *(ushort *)(new_ext + 2) = uVar4;
  iVar11 = (int)(short)puVar17[1];
  uVar4 = *puVar17;
  iVar15 = (int)(short)*(ushort *)((long)ext2 + 2);
  iVar16 = iVar15 - (uint)*(ushort *)ext2;
  uVar5 = *(ushort *)new_ext;
  uVar19 = uVar18 - uVar5;
  iVar14 = 0;
  if ((((int)uVar19 <= iVar15) && (iVar16 < (int)uVar19)) &&
     ((int)uVar19 <= (int)(iVar11 - (uint)uVar4) || iVar11 < (int)uVar19)) {
    uVar12 = (uint)(int)*(char *)((long)ext2 + ((ulong)(long)(int)(iVar15 - uVar19) >> 1) + 5) >>
             (~((char)(iVar15 - uVar19) * '\x04') & 4U) & 0xf;
    if (uVar12 < 6) {
      iVar14 = 0;
      if (uVar12 != 5) goto LAB_00262fd7;
      lVar10 = (long)(short)uVar3;
      if ((long)(short)uVar3 < (long)(short)uVar2) {
        lVar10 = (long)(short)uVar2;
      }
      iVar1 = ((iVar15 + (uint)uVar5) - (int)lVar10) * 4;
      uVar13 = (long)iVar15 - ((int)-(uint)uVar5 + lVar10);
      do {
        iVar1 = iVar1 + 4;
        uVar13 = uVar13 + 1;
        if (*(ushort *)ext2 <= uVar13) goto LAB_00262fd7;
      } while ((*(byte *)((long)ext2 + (uVar13 >> 1) + 5) >> (~(byte)iVar1 & 4) & 0xf) == 0);
    }
    iVar14 = -1;
  }
LAB_00262fd7:
  uVar12 = ~uVar18 + (uint)uVar5;
  for (; (int)uVar19 < (int)uVar18; uVar19 = uVar19 + 1) {
    uVar8 = 0;
    if (((int)(iVar11 - (uint)uVar4) <= (int)uVar19) && ((int)uVar19 < iVar11)) {
      uVar8 = (uint)(int)*(char *)((long)puVar17 +
                                  ((ulong)(long)(int)((int)(short)puVar17[1] + uVar12) >> 1) + 5) >>
              (~((char)((int)(short)puVar17[1] + uVar12) * '\x04') & 4U) & 0xf;
    }
    uVar7 = uVar12;
    if ((iVar16 <= (int)uVar19) && ((int)uVar19 < iVar15)) {
      uVar8 = uVar8 - ((uint)(int)*(char *)((long)ext2 +
                                           ((ulong)(long)(int)((int)(short)*(ushort *)
                                                                            ((long)ext2 + 2) +
                                                              uVar12) >> 1) + 5) >>
                       (~((char)((int)(short)*(ushort *)((long)ext2 + 2) + uVar12) * '\x04') & 4U) &
                      0xf);
      uVar7 = ~uVar19;
    }
    uVar9 = uVar8 + iVar14;
    uVar8 = uVar8 + 10 + iVar14;
    if (-1 < (int)uVar9) {
      uVar8 = uVar9;
    }
    set_dig(new_ext,(long)(int)((int)*(short *)(new_ext + 2) + uVar7),uVar8);
    uVar12 = uVar12 - 1;
    iVar14 = (int)uVar9 >> 0x1f;
  }
  new_ext[4] = (byte)((uint)iVar6 >> 0x1f) | new_ext[4] & 0xfeU;
  normalize(new_ext);
  return;
}

Assistant:

void CVmObjBigNum::compute_abs_diff_into(char *new_ext,
                                         const char *ext1, const char *ext2)
{
    int max_exp;
    int lo1, hi1;
    int lo2, hi2;
    int lo3, hi3;
    int pos;
    int result_neg = FALSE;
    int borrow;

    /* if we're subtracting zero or from zero, it's easy */
    if (is_zero(ext2))
    {
        /* 
         *   we're subtracting zero from another value - the result is
         *   simply the first value 
         */
        copy_val(new_ext, ext1, TRUE);
        return;
    }
    else if (is_zero(ext1))
    {
        /* 
         *   We're subtracting a value from zero - we know the value we're
         *   subtracting is non-zero (we already checked for that case
         *   above), and we're only considering the absolute values, so
         *   simply return the negative of the absolute value of the
         *   second operand.  
         */
        copy_val(new_ext, ext2, TRUE);
        set_neg(new_ext, TRUE);
        return;
    }

    /*
     *   Compare the absolute values of the two operands.  If the first
     *   value is larger than the second, subtract them in the given
     *   order.  Otherwise, reverse the order and note that the result is
     *   negative. 
     */
    if (compare_abs(ext1, ext2) < 0)
    {
        const char *tmp;
        
        /* the result will be negative */
        result_neg = TRUE;

        /* swap the order of the subtraction */
        tmp = ext1;
        ext1 = ext2;
        ext2 = tmp;
    }

    /* 
     *   start the new value with the larger of the two exponents - this
     *   will have the desired effect of dropping the least significant
     *   digits if any digits must be dropped 
     */
    max_exp = get_exp(ext1);
    if (get_exp(ext2) > max_exp)
        max_exp = get_exp(ext2);
    set_exp(new_ext, max_exp);

    /* compute the digit positions at the bounds of each of our values */
    hi1 = get_exp(ext1) - 1;
    lo1 = get_exp(ext1) - get_prec(ext1);

    hi2 = get_exp(ext2) - 1;
    lo2 = get_exp(ext2) - get_prec(ext2);

    hi3 = get_exp(new_ext) - 1;
    lo3 = get_exp(new_ext) - get_prec(new_ext);

    /* start off with no borrow */
    borrow = 0;

    /*
     *   Check for borrowing from before the least significant digit
     *   position in common to both numbers 
     */
    if (lo3-1 >= lo1 && lo3-1 <= hi1)
    {
        /* 
         *   In this case, we would be dropping precision from the end of
         *   the top number.  This case should never happen - the only way
         *   it could happen is for the bottom number to extend to the
         *   left of the top number at the most significant end.  This
         *   cannot happen because the bottom number always has small
         *   magnitude by this point (we guarantee this above).  So, we
         *   should never get here.
         */
        assert(FALSE);
    }
    else if (lo3-1 >= lo2 && lo3-1 <= hi2)
    {
        size_t idx;
        
        /*
         *   We're dropping precision from the bottom number, so we want
         *   to borrow into the subtraction if the rest of the number is
         *   greater than 5xxxx.  If it's exactly 5000..., do not borrow,
         *   since the result would end in 5 and we'd round up.
         *   
         *   If the next digit is 6 or greater, we know for a fact we'll
         *   have to borrow.  If the next digit is 4 or less, we know for
         *   a fact we won't have to borrow.  If the next digit is 5,
         *   though, we must look at the rest of the number to see if
         *   there's anything but trailing zeros.  
         */
        idx = (size_t)(get_exp(ext2) - (lo3-1) - 1);
        if (get_dig(ext2, idx) >= 6)
        {
            /* definitely borrow */
            borrow = 1;
        }
        else if (get_dig(ext2, idx) == 5)
        {
            /* borrow only if we have something non-zero following */
            for (++idx ; idx < get_prec(ext2) ; ++idx)
            {
                /* if it's non-zero, we must borrow */
                if (get_dig(ext2, idx) != 0)
                {
                    /* note the borrow */
                    borrow = 1;

                    /* no need to keep scanning */
                    break;
                }
            }
        }
    }

    /* subtract the digits from least to most significant */
    for (pos = lo3 ; pos <= hi3 ; ++pos)
    {
        int acc;

        /* start with zero in the accumulator */
        acc = 0;

        /* start with the top-line value if it's represented here */
        if (pos >= lo1 && pos <= hi1)
            acc = get_dig(ext1, get_exp(ext1) - pos - 1);

        /* subtract the second value digit if it's represented here */
        if (pos >= lo2 && pos <= hi2)
            acc -= get_dig(ext2, get_exp(ext2) - pos - 1);

        /* subtract the borrow */
        acc -= borrow;

        /* check for borrow */
        if (acc < 0)
        {
            /* increase the accumulator */
            acc += 10;

            /* we must borrow from the next digit up */
            borrow = 1;
        }
        else
        {
            /* we're in range - no need to borrow */
            borrow = 0;
        }

        /* set the digit in the result */
        set_dig(new_ext, get_exp(new_ext) - pos - 1, acc);
    }

    /* set the sign of the result as calculated earlier */
    set_neg(new_ext, result_neg);

    /* normalize the number */
    normalize(new_ext);
}